

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

Am_Slot __thiscall Am_Object_Advanced::Get_Slot(Am_Object_Advanced *this,Am_Slot_Key key)

{
  uint *puVar1;
  Am_Value_Type AVar2;
  uint uVar3;
  Am_Object_Data *pAVar4;
  char *pcVar5;
  Am_Wrapper *pAVar6;
  ushort uVar7;
  Am_Slot_Data *pAVar8;
  Am_Slot_Data *this_00;
  long lVar9;
  Am_Slot_Data *new_slot;
  Am_Slot_Data *local_28;
  
  pAVar4 = (this->super_Am_Object).data;
  if (pAVar4 == (Am_Object_Data *)0x0) {
    Am_Error("** Get_Slot called on a (0L) object");
  }
  pcVar5 = (pAVar4->data).data;
  if (pcVar5 == (char *)0x0) {
    Am_Error("** Get_Slot called on a destroyed object");
  }
  if (key == 10) {
    local_28 = &pAVar4->owner_slot;
  }
  else {
    uVar3 = (pAVar4->data).length;
    if (uVar3 != 0) {
      lVar9 = 0;
      do {
        pAVar8 = *(Am_Slot_Data **)(pcVar5 + lVar9 * 8);
        if (pAVar8->key == key) {
          return (Am_Slot)pAVar8;
        }
        lVar9 = lVar9 + 1;
      } while (uVar3 != (uint)lVar9);
    }
    if (((pAVar4->prototype != (Am_Object_Data *)0x0) &&
        (pAVar8 = Am_Object_Data::find_slot(pAVar4->prototype,key), pAVar8 != (Am_Slot_Data *)0x0))
       && ((*(ushort *)&pAVar8->field_0x38 & 0x20) == 0)) {
      if ((~*(ushort *)&pAVar8->field_0x38 & 0x300) == 0) {
        return (Am_Slot)pAVar8;
      }
      this_00 = (Am_Slot_Data *)Dyn_Memory_Manager::New(&Am_Slot_Data::memory);
      Am_Slot_Data::Am_Slot_Data(this_00,(this->super_Am_Object).data,key);
      uVar7 = (ushort)(byte)this_00->field_0x39 << 8 | *(ushort *)&pAVar8->field_0x38 & 0xe0;
      *(ushort *)&this_00->field_0x38 = uVar7;
      if ((*(ushort *)&pAVar8->field_0x38 & 0x300) == 0x100) {
        uVar7 = uVar7 | 3;
        *(ushort *)&this_00->field_0x38 = uVar7;
      }
      this_00->type_check = pAVar8->type_check;
      this_00->enabled_demons = pAVar8->enabled_demons;
      *(ushort *)&this_00->field_0x38 = uVar7 & 0xfcff | *(ushort *)&pAVar8->field_0x38 & 0x300;
      if ((pAVar8->field_0x39 & 3) == 0) {
        (this_00->super_Am_Value).type = 0x1002;
      }
      else {
        AVar2 = (pAVar8->super_Am_Value).type;
        (this_00->super_Am_Value).type = AVar2;
        if (((short)AVar2 < 0) &&
           (pAVar6 = (pAVar8->super_Am_Value).value.wrapper_value, pAVar6 != (Am_Wrapper *)0x0)) {
          puVar1 = &pAVar6->refs;
          *puVar1 = *puVar1 + 1;
        }
        (this_00->super_Am_Value).value = (pAVar8->super_Am_Value).value;
      }
      local_28 = this_00;
      DynArray::Add(&((this->super_Am_Object).data)->data,(char *)&local_28);
      return (Am_Slot)local_28;
    }
    pAVar8 = (Am_Slot_Data *)Dyn_Memory_Manager::New(&Am_Slot_Data::memory);
    Am_Slot_Data::Am_Slot_Data(pAVar8,(this->super_Am_Object).data,key);
    pAVar8->field_0x38 = 3;
    (pAVar8->super_Am_Value).type = 0x1002;
    (pAVar8->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
    local_28 = pAVar8;
    DynArray::Add(&((this->super_Am_Object).data)->data,(char *)&local_28);
  }
  return (Am_Slot)local_28;
}

Assistant:

Am_Slot
Am_Object_Advanced::Get_Slot(Am_Slot_Key key) const
{
  if (!data)
    Am_Error("** Get_Slot called on a (0L) object");
  if (!data->data.data)
    Am_Error("** Get_Slot called on a destroyed object");
  if (key == Am_OWNER)
    return &data->owner_slot;

  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = data->data.length, slot_array = (Am_Slot_Data **)data->data.data;
       i > 0; --i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key)
      return slot;
  }
  if (data->prototype) {
    slot = data->prototype->find_slot(key);
    if (slot && !(slot->flags & BIT_IS_PART)) {
      if (slot->rule == Am_STATIC)
        return slot;
      Am_Slot_Data *new_slot = new Am_Slot_Data(data, key);
      new_slot->flags = slot->flags & DATA_BITS;
      if (slot->rule == Am_INHERIT)
        new_slot->flags |= BIT_INHERITS | BIT_IS_INHERITED;
      new_slot->type_check = slot->type_check;
      new_slot->enabled_demons = slot->enabled_demons;
      new_slot->rule = slot->rule;
      if (slot->rule == Am_LOCAL)
        new_slot->type = Am_MISSING_SLOT;
      else {
        new_slot->type = slot->type;
        if (Am_Type_Is_Ref_Counted(slot->type) && slot->value.wrapper_value)
          slot->value.wrapper_value->Note_Reference();
        new_slot->value = slot->value;
      }
      data->data.Add((char *)&new_slot);
      return new_slot;
    }
  }
  Am_Slot_Data *new_slot = new Am_Slot_Data(data, key);
  new_slot->flags = BIT_INHERITS | BIT_IS_INHERITED;
  new_slot->type = Am_MISSING_SLOT;
  new_slot->value.wrapper_value = nullptr;
  data->data.Add((char *)&new_slot);
  return new_slot;
}